

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpIsOnA(word *a,ec_o *ec,void *stack)

{
  long lVar1;
  int iVar2;
  word *b;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *t2;
  word *t1;
  size_t n;
  word *n_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar1 = *(long *)(in_RSI[3] + 0x30);
  b = in_RDX + lVar1;
  n_00 = b + lVar1;
  iVar2 = wwCmp(in_RDI,*(word **)(in_RSI[3] + 0x18),*(size_t *)(in_RSI[3] + 0x30));
  if ((iVar2 < 0) &&
     (iVar2 = wwCmp(in_RDI + lVar1,*(word **)(in_RSI[3] + 0x18),*(size_t *)(in_RSI[3] + 0x30)),
     iVar2 < 0)) {
    (**(code **)(in_RSI[3] + 0x70))(in_RDX,in_RDI,in_RSI[3],n_00);
    zzAddMod(t2,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
             (size_t)n_00);
    (**(code **)(in_RSI[3] + 0x68))(in_RDX,in_RDX,in_RDI,in_RSI[3],n_00);
    zzAddMod(t2,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
             (size_t)n_00);
    (**(code **)(in_RSI[3] + 0x70))(b,in_RDI + lVar1,in_RSI[3],n_00);
    iVar2 = wwCmp(in_RDX,b,*(size_t *)(in_RSI[3] + 0x30));
    return (uint)(iVar2 == 0);
  }
  return 0;
}

Assistant:

bool_t ecpIsOnA(const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	stack = t2 + n;
	// pre
	ASSERT(ecIsOperable(ec));
	// xa, ya \in ec->f?
	if (!zmIsIn(ecX(a), ec->f) || !zmIsIn(ecY(a, n), ec->f))
		return FALSE;
	// t1 <- (xa^2 + A)xa + B
	qrSqr(t1, ecX(a), ec->f, stack);
	zmAdd(t1, t1, ec->A, ec->f);
	qrMul(t1, t1, ecX(a), ec->f, stack);
	zmAdd(t1, t1, ec->B, ec->f);
	// t2 <- ya^2
	qrSqr(t2, ecY(a, n), ec->f, stack);
	// t1 == t2?
	return qrCmp(t1, t2, ec->f) == 0;
}